

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

quatd * tinyusdz::to_quaternion(quatd *__return_storage_ptr__,double3 *axis,double angle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (angle * 0.5) / 180.0;
  dVar2 = math::sin_pi_imp<double>(dVar1);
  dVar3 = math::cos_pi_imp<double>(dVar1);
  dVar1 = axis->_M_elems[1];
  (__return_storage_ptr__->imag)._M_elems[0] = dVar2 * axis->_M_elems[0];
  (__return_storage_ptr__->imag)._M_elems[1] = dVar2 * dVar1;
  (__return_storage_ptr__->imag)._M_elems[2] = dVar2 * axis->_M_elems[2];
  __return_storage_ptr__->real = dVar3;
  return __return_storage_ptr__;
}

Assistant:

value::quatd to_quaternion(const value::double3 &axis, const double angle) {

  // Use sin_pi and cos_pi for better accuracy.
  double s = math::sin_pi(angle/2.0/180.0);
  double c = math::cos_pi(angle/2.0/180.0);

  value::quatd q;
  q.imag[0] = axis[0] * s;
  q.imag[1] = axis[1] * s;
  q.imag[2] = axis[2] * s;
  q.real = c;

  return q;
}